

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O2

TouchPoint * __thiscall
QTuioHandler::cursorToTouchPoint
          (TouchPoint *__return_storage_ptr__,QTuioHandler *this,QTuioCursor *tc,QWindow *win)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  int extraout_var;
  QPoint QVar6;
  undefined8 uVar7;
  int extraout_var_00;
  long lVar8;
  undefined8 *puVar9;
  TouchPoint *pTVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  QPointF QVar13;
  float fStack_4c;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar9 = &DAT_0010f528;
  pTVar10 = __return_storage_ptr__;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pTVar10 = *puVar9;
    puVar9 = puVar9 + 1;
    pTVar10 = (TouchPoint *)&pTVar10->uniqueId;
  }
  __return_storage_ptr__->uniqueId = -1;
  (__return_storage_ptr__->area).xp = 0.0;
  (__return_storage_ptr__->area).yp = 0.0;
  (__return_storage_ptr__->area).w = 0.0;
  (__return_storage_ptr__->area).h = 0.0;
  __return_storage_ptr__->pressure = 0.0;
  __return_storage_ptr__->rotation = 0.0;
  __return_storage_ptr__->state = Stationary;
  *(undefined8 *)(__return_storage_ptr__->velocity).v = 0;
  (__return_storage_ptr__->rawPositions).d.d = (Data *)0x0;
  (__return_storage_ptr__->rawPositions).d.ptr = (QPointF *)0x0;
  (__return_storage_ptr__->rawPositions).d.size = 0;
  __return_storage_ptr__->id = tc->m_id;
  __return_storage_ptr__->pressure = 1.0;
  uVar1 = tc->m_x;
  uVar2 = tc->m_y;
  (__return_storage_ptr__->normalPosition).xp = (double)(float)uVar1;
  (__return_storage_ptr__->normalPosition).yp = (double)(float)uVar2;
  bVar4 = QTransform::isIdentity((QTransform *)(this + 0x68));
  if (!bVar4) {
    QVar13 = (QPointF)QTransform::map((QPointF *)(this + 0x68));
    __return_storage_ptr__->normalPosition = QVar13;
  }
  __return_storage_ptr__->state = tc->m_state;
  iVar5 = (**(code **)(*(long *)win + 0x70))(win);
  dVar11 = (__return_storage_ptr__->normalPosition).xp;
  (**(code **)(*(long *)win + 0x70))(win);
  local_38.yp = (double)extraout_var * (__return_storage_ptr__->normalPosition).yp;
  local_38.xp = (double)iVar5 * dVar11;
  QVar6 = QPointF::toPoint(&local_38);
  dVar11 = local_38.xp - (double)QVar6.xp.m_i.m_i;
  dVar12 = local_38.yp - (double)QVar6.yp.m_i.m_i;
  QPointF::toPoint(&local_38);
  uVar7 = QWindow::mapToGlobal((QPoint *)win);
  (__return_storage_ptr__->area).xp =
       (__return_storage_ptr__->area).w * -0.5 + (double)(int)uVar7 + dVar11;
  (__return_storage_ptr__->area).yp =
       (__return_storage_ptr__->area).h * -0.5 + (double)(int)((ulong)uVar7 >> 0x20) + dVar12;
  iVar5 = (**(code **)(*(long *)win + 0x70))(win);
  uVar3 = tc->m_vx;
  (**(code **)(*(long *)win + 0x70))(win);
  *(ulong *)(__return_storage_ptr__->velocity).v =
       CONCAT44(tc->m_vy * (float)extraout_var_00,(float)uVar3 * (float)iVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QWindowSystemInterface::TouchPoint QTuioHandler::cursorToTouchPoint(const QTuioCursor &tc, QWindow *win)
{
    QWindowSystemInterface::TouchPoint tp;
    tp.id = tc.id();
    tp.pressure = 1.0f;

    tp.normalPosition = QPointF(tc.x(), tc.y());

    if (!m_transform.isIdentity())
        tp.normalPosition = m_transform.map(tp.normalPosition);

    tp.state = tc.state();

    // we map the touch to the size of the window. we do this, because frankly,
    // trying to figure out which part of the screen to hit in order to press an
    // element on the UI is pretty tricky when one is not using an overlay-style
    // TUIO device.
    //
    // in the future, it might make sense to make this choice optional,
    // dependent on the spec.
    QPointF relPos = QPointF(win->size().width() * tp.normalPosition.x(), win->size().height() * tp.normalPosition.y());
    QPointF delta = relPos - relPos.toPoint();
    tp.area.moveCenter(win->mapToGlobal(relPos.toPoint()) + delta);
    tp.velocity = QVector2D(win->size().width() * tc.vx(), win->size().height() * tc.vy());
    return tp;
}